

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathQuat.h
# Opt level: O0

Quat<float> * __thiscall Imath_2_5::Quat<float>::normalize(Quat<float> *this)

{
  Quat<float> *in_RDI;
  float l;
  Vec3<float> local_18;
  float local_c;
  
  local_c = length(in_RDI);
  if ((local_c != 0.0) || (NAN(local_c))) {
    in_RDI->r = in_RDI->r / local_c;
    Vec3<float>::operator/=(&in_RDI->v,local_c);
  }
  else {
    in_RDI->r = 1.0;
    Vec3<float>::Vec3(&local_18,0.0);
    Vec3<float>::operator=(&in_RDI->v,&local_18);
  }
  return in_RDI;
}

Assistant:

inline Quat<T> &
Quat<T>::normalize ()
{
    if (T l = length())
    {
	r /= l;
	v /= l;
    }
    else
    {
	r = 1;
	v = Vec3<T> (0);
    }

    return *this;
}